

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::ClearOneof
          (Reflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  int key;
  string *psVar1;
  string *psVar2;
  pointer pcVar3;
  uint32 uVar4;
  FieldDescriptor *field;
  ulong uVar5;
  LogMessage *other;
  long *plVar6;
  ArenaStringPtr *pAVar7;
  LogMessage local_70;
  FieldDescriptor *local_38;
  
  if ((*(int *)(oneof_descriptor + 0x18) == 1) &&
     (((FieldDescriptor *)**(undefined8 **)(oneof_descriptor + 0x20))[0x41] == (FieldDescriptor)0x1)
     ) {
    ClearField(this,message,(FieldDescriptor *)**(undefined8 **)(oneof_descriptor + 0x20));
    return;
  }
  key = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                           *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >>
                                   4) * -0x55555554 + (this->schema_).oneof_case_offset_));
  if (key != 0) {
    field = Descriptor::FindFieldByNumber(this->descriptor_,key);
    uVar5 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                      (ulong)(uint)(this->schema_).metadata_offset_);
    if ((uVar5 & 1) != 0) {
      uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
    }
    if (uVar5 == 0) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_70._0_8_ = FieldDescriptor::TypeOnceInit;
        local_38 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_70,
                   &local_38);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
        uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
        plVar6 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
        if (plVar6 != (long *)0x0) {
          (**(code **)(*plVar6 + 8))();
        }
      }
      else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) ==
               9) {
        plVar6 = (long *)internal::ReflectionSchema::GetFieldDefault(&this->schema_,field);
        psVar1 = (string *)*plVar6;
        pAVar7 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
        uVar5 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                          (ulong)(uint)(this->schema_).metadata_offset_);
        if ((uVar5 & 1) != 0) {
          uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
        }
        if ((uVar5 == 0) && (psVar2 = pAVar7->ptr_, psVar2 != psVar1)) {
          if ((psVar2 != (string *)0x0) &&
             (pcVar3 = (psVar2->_M_dataplus)._M_p,
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar3 != &psVar2->field_2)) {
            operator_delete(pcVar3);
          }
          operator_delete(psVar2);
        }
      }
    }
    if ((*(int *)(oneof_descriptor + 0x18) == 1) &&
       (*(char *)(**(long **)(oneof_descriptor + 0x20) + 0x41) == '\x01')) {
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x768);
      other = internal::LogMessage::operator<<
                        (&local_70,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_38,other);
      internal::LogMessage::~LogMessage(&local_70);
    }
    *(undefined4 *)
     ((long)&(message->super_MessageLite)._vptr_MessageLite +
     (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >> 4) *
                   -0x55555554 + (this->schema_).oneof_case_offset_)) = 0;
  }
  return;
}

Assistant:

void Reflection::ClearOneof(Message* message,
                            const OneofDescriptor* oneof_descriptor) const {
  if (oneof_descriptor->is_synthetic()) {
    ClearField(message, oneof_descriptor->field(0));
    return;
  }
  // TODO(jieluo): Consider to cache the unused object instead of deleting
  // it. It will be much faster if an application switches a lot from
  // a few oneof fields.  Time/space tradeoff
  uint32 oneof_case = GetOneofCase(*message, oneof_descriptor);
  if (oneof_case > 0) {
    const FieldDescriptor* field = descriptor_->FindFieldByNumber(oneof_case);
    if (GetArena(message) == nullptr) {
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              const std::string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              MutableField<ArenaStringPtr>(message, field)
                  ->Destroy(default_ptr, GetArena(message));
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          delete *MutableRaw<Message*>(message, field);
          break;
        default:
          break;
      }
    }

    *MutableOneofCase(message, oneof_descriptor) = 0;
  }
}